

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# car-cdr.c
# Opt level: O3

ConsCell * find_cdrpair_in_page(conspage *pg,LispPTR carpart,LispPTR cdrpart)

{
  uint uVar1;
  ulong uVar2;
  ConsCell *pCVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  
  uVar4 = *(uint *)&pg->field_0x8;
  if ((uVar4 < 0x2000000) || (uVar9 = uVar4 >> 0x10 & 0xff, uVar9 == 0)) {
    return (ConsCell *)0x0;
  }
  uVar8 = 0;
  uVar5 = 0;
  while( true ) {
    uVar10 = uVar9;
    if (uVar5 <= uVar10 + 0xe && uVar10 < uVar5) {
      uVar1 = 0;
      uVar9 = uVar10;
      goto LAB_001137b5;
    }
    uVar7 = (ulong)uVar10;
    if (uVar10 <= uVar5 + 0xe && (uVar5 < uVar10 && uVar5 != 0)) break;
    uVar1 = *(uint *)((long)&pg->cell6 + uVar7 * 2);
    uVar8 = (ulong)uVar5;
    uVar9 = uVar1 >> 0x18;
    uVar5 = uVar10;
    if (uVar1 < 0x1000000) {
      return (ConsCell *)0x0;
    }
  }
  uVar2 = (ulong)uVar5;
  uVar9 = *(uint *)((long)&pg->cell6 + uVar7 * 2);
  if ((int)uVar8 == 0) {
    uVar4 = uVar4 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar8 * 2 + 3) = (char)(uVar9 >> 0x18);
    uVar4 = *(uint *)&pg->field_0x8;
  }
  pCVar3 = (ConsCell *)((long)&pg->cell6 + uVar2 * 2);
  *(uint *)&pg->field_0x8 = uVar4 + 0xfe000000;
  goto LAB_00113879;
  while (uVar10 = uVar5, uVar1 = uVar9, uVar9 = uVar12, uVar12 < uVar5) {
LAB_001137b5:
    uVar11 = uVar1;
    uVar6 = uVar10;
    uVar2 = (ulong)uVar9;
    uVar12 = *(uint *)((long)&pg->cell6 + uVar2 * 2) >> 0x18;
    if (uVar12 <= uVar9) break;
  }
  uVar7 = (ulong)uVar5;
  uVar9 = *(uint *)((long)&pg->cell6 + (ulong)uVar6 * 2);
  if ((int)uVar8 == 0) {
    *(uint *)&pg->field_0x8 = uVar4 & 0xff00ffff | uVar9 >> 8 & 0xff0000;
  }
  else {
    *(char *)((long)&pg->cell6 + uVar8 * 2 + 3) = (char)(uVar9 >> 0x18);
  }
  pCVar3 = (ConsCell *)((long)&pg->cell6 + uVar2 * 2);
  if (uVar11 != 0) {
    *(undefined1 *)((long)&pg->cell6 + (ulong)uVar11 * 2 + 3) = pCVar3->field_0x3;
  }
  pg->field_0xb = (char)((uint)(byte)pg->field_0xb * 0x1000000 + -0x2000000 >> 0x18);
LAB_00113879:
  *(LispPTR *)((long)&pg->cell6 + uVar2 * 2) = carpart;
  *(LispPTR *)((long)&pg->cell6 + uVar7 * 2) = cdrpart;
  *pCVar3 = (ConsCell)
            ((uint)*pCVar3 & 0xfffffff | ((int)(uVar7 * 2) - (int)(uVar2 * 2) & 0xfffffffcU) << 0x1a
            );
  return pCVar3;
}

Assistant:

static ConsCell *find_cdrpair_in_page(struct conspage *pg, LispPTR carpart, LispPTR cdrpart) {
  unsigned offset, prior, priorprior, nprior, poffset, noffset;

  prior = priorprior = nprior = 0;

  if (pg->count < 2) return (ConsCell *)0;

  offset = pg->next_cell;

  while (offset) {
    if (prior && (offset < prior) && (prior <= offset + 14)) {
      ConsCell *carcell, *cdrcell;

      poffset = offset;
      noffset = FREECONS(pg, offset)->next_free;
      while ((noffset > offset) && (noffset < prior)) {
        nprior = offset;
        poffset = prior;
        offset = noffset;
        noffset = FREECONS(pg, offset)->next_free;
      }

      carcell = (ConsCell *)(((DLword *)pg) + offset);
      cdrcell = (ConsCell *)(((DLword *)pg) + prior);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = FREECONS(pg, poffset)->next_free;
      else
        pg->next_cell = FREECONS(pg, poffset)->next_free;

      if (nprior) FREECONS(pg, nprior)->next_free = FREECONS(pg, offset)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    } else if (prior && (offset > prior) && (offset <= prior + 14)) {
      ConsCell *carcell, *cdrcell;

      carcell = (ConsCell *)(((DLword *)pg) + prior);
      cdrcell = (ConsCell *)(((DLword *)pg) + offset);
      if (priorprior)
        FREECONS(pg, priorprior)->next_free = ((freecons *)cdrcell)->next_free;
      else
        pg->next_cell = ((freecons *)cdrcell)->next_free;

      pg->count -= 2;

      *(LispPTR *)carcell = carpart;
      *(LispPTR *)cdrcell = cdrpart;

      carcell->cdr_code = (cdrcell - carcell);
      return (carcell);
    }
    priorprior = prior;
    prior = offset;
    offset = FREECONS(pg, offset)->next_free;
  }

  return (0); /* found no entries in this page, so return failure code */
}